

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::IsArray(RecyclableObject *instance)

{
  bool bVar1;
  BOOL BVar2;
  undefined8 local_30;
  JavascriptProxy *proxy;
  RecyclableObject *instance_local;
  
  bVar1 = DynamicObject::IsAnyArray(instance);
  if (bVar1) {
    instance_local._7_1_ = true;
  }
  else {
    bVar1 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(instance);
    if (bVar1) {
      local_30 = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(instance);
    }
    else {
      local_30 = (JavascriptProxy *)0x0;
    }
    if (local_30 == (JavascriptProxy *)0x0) {
      BVar2 = IsRemoteArray(instance);
      instance_local._7_1_ = BVar2 != 0;
    }
    else {
      instance_local._7_1_ = IsArray(local_30);
    }
  }
  return instance_local._7_1_;
}

Assistant:

bool JavascriptOperators::IsArray(_In_ RecyclableObject* instance)
    {
        if (DynamicObject::IsAnyArray(instance))
        {
            return TRUE;
        }

        JavascriptProxy* proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instance);
        if (proxy)
        {
            return IsArray(proxy);
        }

        return IsRemoteArray(instance);
    }